

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedRegionProfile.cpp
# Opt level: O2

double __thiscall cali::BufferedRegionProfile::region_time(BufferedRegionProfile *this,char *region)

{
  element_type *this_00;
  iterator iVar1;
  double dVar2;
  allocator<char> local_39;
  key_type local_38;
  
  this_00 = (this->mP).
            super___shared_ptr<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,region,&local_39);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(((this->mP).
         super___shared_ptr<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->reg_times)._M_t._M_impl.super__Rb_tree_header) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = *(double *)(iVar1._M_node + 2);
  }
  return dVar2;
}

Assistant:

double BufferedRegionProfile::region_time(const char* region) const
{
    auto it = mP->reg_times.find(region);
    return (it == (mP->reg_times).end() ? 0.0 : it->second);
}